

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void al_backup_dirty_bitmaps(ALLEGRO_DISPLAY *display)

{
  ALLEGRO_BITMAP *bitmap;
  undefined8 *puVar1;
  ALLEGRO_DISPLAY *pAVar2;
  ALLEGRO_DISPLAY *in_RDI;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_BITMAP **bptr;
  uint i;
  uint local_c;
  
  for (local_c = 0; (ulong)local_c < (in_RDI->bitmaps)._size; local_c = local_c + 1) {
    puVar1 = (undefined8 *)_al_vector_ref(&in_RDI->bitmaps,local_c);
    bitmap = (ALLEGRO_BITMAP *)*puVar1;
    pAVar2 = _al_get_bitmap_display(bitmap);
    if (((pAVar2 == in_RDI) && (bitmap->vt != (ALLEGRO_BITMAP_INTERFACE *)0x0)) &&
       (bitmap->vt->backup_dirty_bitmap != (_func_void_ALLEGRO_BITMAP_ptr *)0x0)) {
      (*bitmap->vt->backup_dirty_bitmap)(bitmap);
    }
  }
  return;
}

Assistant:

void al_backup_dirty_bitmaps(ALLEGRO_DISPLAY *display)
{
   unsigned int i;

   for (i = 0; i < display->bitmaps._size; i++) {
      ALLEGRO_BITMAP **bptr = (ALLEGRO_BITMAP **)_al_vector_ref(&display->bitmaps, i);
      ALLEGRO_BITMAP *bmp = *bptr;
      if (_al_get_bitmap_display(bmp) == display) {
         if (bmp->vt && bmp->vt->backup_dirty_bitmap) {
            bmp->vt->backup_dirty_bitmap(bmp);
	 }
      }
   }
}